

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

Uint32 __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::AllocateDynamicBufferId
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this)

{
  bool bVar1;
  reference pvVar2;
  atomic<unsigned_int> *paVar3;
  Uint32 local_3c;
  Uint32 Id;
  SpinLockGuard Guard;
  RenderDeviceBase<Diligent::EngineVkImplTraits> *this_local;
  
  Guard._M_device = (mutex_type *)this;
  std::lock_guard<Threading::SpinLock>::lock_guard
            ((lock_guard<Threading::SpinLock> *)&stack0xffffffffffffffc8,
             &this->m_RecycledDynamicBufferIdsLock);
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    (&this->m_RecycledDynamicBufferIds);
  if (bVar1) {
    paVar3 = &this->m_NextDynamicBufferId;
    LOCK();
    this_local._4_4_ = (paVar3->super___atomic_base<unsigned_int>)._M_i;
    (paVar3->super___atomic_base<unsigned_int>)._M_i =
         (paVar3->super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
  }
  else {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                       (&this->m_RecycledDynamicBufferIds);
    local_3c = *pvVar2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
              (&this->m_RecycledDynamicBufferIds);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::erase((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             *)&this->m_DbgRecycledDynamicBufferIds,&local_3c);
    this_local._4_4_ = local_3c;
  }
  std::lock_guard<Threading::SpinLock>::~lock_guard
            ((lock_guard<Threading::SpinLock> *)&stack0xffffffffffffffc8);
  return this_local._4_4_;
}

Assistant:

Uint32 AllocateDynamicBufferId()
    {
        Threading::SpinLockGuard Guard{m_RecycledDynamicBufferIdsLock};
        if (!m_RecycledDynamicBufferIds.empty())
        {
            Uint32 Id = m_RecycledDynamicBufferIds.back();
            m_RecycledDynamicBufferIds.pop_back();
#ifdef DILIGENT_DEBUG
            m_DbgRecycledDynamicBufferIds.erase(Id);
#endif
            return Id;
        }
        else
        {
            return m_NextDynamicBufferId.fetch_add(1);
        }
    }